

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void copy_suite::unique_copy(void)

{
  basic_iterator<int> first_end;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  allocator_type local_d1;
  vector<int,_std::allocator<int>_> local_d0;
  iterator_type local_b8;
  view_pointer local_a8;
  size_type sStack_a0;
  circular_view<int,_18446744073709551615UL> local_98;
  type local_78 [4];
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_98.member.data = (pointer)0x160000000b;
  local_98.member.cap = 0x2c00000021;
  local_98.member.size = 0x3700000037;
  input._M_len = 6;
  input._M_array = (iterator)&local_98;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  local_98.member.data = local_78;
  local_98.member.cap = 4;
  local_98.member.size = 0;
  local_98.member.next = 4;
  local_b8.current = local_50.member.cap * 2;
  uVar3 = local_b8.current - (local_50.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(local_b8.current - 1 & local_50.member.next - local_50.member.size);
  }
  else {
    local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_50.member.next - local_50.member.size) % local_b8.current);
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_b8.current = local_b8.current - 1 & local_50.member.next;
  }
  else {
    local_b8.current = local_50.member.next % local_b8.current;
  }
  local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_50;
  local_b8.parent = &local_50;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    ((basic_iterator<int> *)&local_d0,&local_b8);
  if (!bVar1) {
    std::
    __unique_copy<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
              (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8.parent,local_b8.current,&local_98);
  }
  local_b8.parent = (view_pointer)0x2c00000021;
  local_b8.current = CONCAT44(local_b8.current._4_4_,0x37);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l,&local_d1);
  uVar3 = local_98.member.cap * 2;
  uVar2 = uVar3 - (local_98.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar4 = uVar3 - 1 & local_98.member.next - local_98.member.size;
  }
  else {
    uVar4 = (local_98.member.next - local_98.member.size) % uVar3;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_a0 = uVar3 - 1 & local_98.member.next;
  }
  else {
    sStack_a0 = local_98.member.next % uVar3;
  }
  first_end.current = sStack_a0;
  first_end.parent = &local_98;
  first_begin.current = uVar4;
  first_begin.parent = &local_98;
  local_a8 = &local_98;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xc9,"void copy_suite::unique_copy()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void unique_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::unique_copy(span.begin(), span.end(), std::back_inserter(copy));
    {
        std::vector<int> expect = { 33, 44, 55 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}